

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_op.h
# Opt level: O2

string * absl::lts_20240722::log_internal::MakeCheckOpString<unsigned_char,long>
                   (uchar v1,long v2,char *exprtext)

{
  long lVar1;
  string *psVar2;
  CheckOpMessageBuilder comb;
  CheckOpMessageBuilder local_190 [376];
  
  absl::lts_20240722::log_internal::CheckOpMessageBuilder::CheckOpMessageBuilder(local_190,exprtext)
  ;
  absl::lts_20240722::log_internal::MakeCheckOpValueString((ostream *)local_190,v1);
  lVar1 = absl::lts_20240722::log_internal::CheckOpMessageBuilder::ForVar2();
  std::ostream::_M_insert<long>(lVar1);
  psVar2 = (string *)absl::lts_20240722::log_internal::CheckOpMessageBuilder::NewString_abi_cxx11_()
  ;
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  return psVar2;
}

Assistant:

std::string* MakeCheckOpString(T1 v1, T2 v2, const char* exprtext) {
  CheckOpMessageBuilder comb(exprtext);
  MakeCheckOpValueString(comb.ForVar1(), v1);
  MakeCheckOpValueString(comb.ForVar2(), v2);
  return comb.NewString();
}